

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor_rational.hpp
# Opt level: O3

void __thiscall soplex::CLUFactorRational::remaxRow(CLUFactorRational *this,int p_row,int len)

{
  U *pUVar1;
  VectorRational *pVVar2;
  int *piVar3;
  int *piVar4;
  int *piVar5;
  Dring *pDVar6;
  Dring *pDVar7;
  pointer pnVar8;
  int iVar9;
  int iVar10;
  int *piVar11;
  Dring *pDVar12;
  int iVar13;
  long lVar14;
  uint uVar15;
  ulong uVar16;
  long lVar17;
  long lVar18;
  
  pUVar1 = &this->u;
  if ((U *)(this->u).row.elem[p_row].next == pUVar1) {
    piVar11 = (this->u).row.max;
    iVar10 = len - piVar11[p_row];
    uVar15 = (this->u).row.used;
    iVar9 = (int)((ulong)((long)*(pointer *)
                                 ((long)&(this->u).row.val.val.
                                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                         ._M_impl.super__Vector_impl_data + 8) -
                         (long)(this->u).row.val.val.
                               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 6);
    if (iVar10 <= (int)(iVar9 - uVar15)) goto LAB_001b4cbf;
    pVVar2 = &(this->u).row.val;
    pDVar12 = (this->u).row.list.next;
    if ((U *)pDVar12 == pUVar1) {
      uVar15 = 0;
    }
    else {
      piVar3 = (this->u).row.idx;
      piVar4 = (this->u).row.len;
      piVar5 = (this->u).row.start;
      uVar16 = 0;
      do {
        iVar10 = pDVar12->idx;
        if (piVar5[iVar10] != (int)uVar16) goto LAB_001b4b79;
        iVar13 = piVar4[iVar10];
        uVar15 = (int)uVar16 + iVar13;
        uVar16 = (ulong)uVar15;
        piVar11[iVar10] = iVar13;
        pDVar12 = pDVar12->next;
      } while ((U *)pDVar12 != pUVar1);
    }
    goto LAB_001b4c45;
  }
  pVVar2 = &(this->u).row.val;
  uVar15 = (this->u).row.used;
  iVar9 = (int)((ulong)((long)*(pointer *)
                               ((long)&(this->u).row.val.val.
                                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                       ._M_impl.super__Vector_impl_data + 8) -
                       (long)(this->u).row.val.val.
                             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 6);
  if (len <= (int)(iVar9 - uVar15)) goto LAB_001b4a69;
  pDVar12 = (this->u).row.list.next;
  piVar11 = (this->u).row.max;
  if ((U *)pDVar12 == pUVar1) {
    uVar15 = 0;
  }
  else {
    piVar3 = (this->u).row.idx;
    piVar4 = (this->u).row.len;
    piVar5 = (this->u).row.start;
    uVar16 = 0;
    do {
      iVar10 = pDVar12->idx;
      if (piVar5[iVar10] != (int)uVar16) goto LAB_001b4934;
      iVar13 = piVar4[iVar10];
      uVar15 = (int)uVar16 + iVar13;
      uVar16 = (ulong)uVar15;
      piVar11[iVar10] = iVar13;
      pDVar12 = pDVar12->next;
    } while ((U *)pDVar12 != pUVar1);
  }
  goto LAB_001b49fe;
LAB_001b4b79:
  do {
    iVar9 = pDVar12->idx;
    iVar10 = piVar5[iVar9];
    lVar14 = (long)iVar10;
    piVar5[iVar9] = (int)uVar16;
    iVar13 = piVar4[iVar9];
    piVar11[iVar9] = iVar13;
    if (0 < iVar13) {
      uVar16 = (ulong)(int)uVar16;
      lVar18 = lVar14 << 6;
      lVar17 = uVar16 << 6;
      do {
        piVar3[uVar16] = piVar3[lVar14];
        pnVar8 = (pVVar2->val).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        boost::multiprecision::backends::
        cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        ::assign((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                  *)((long)&(pnVar8->m_backend).m_value + lVar17),
                 (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                  *)((long)&(pnVar8->m_backend).m_value + lVar18));
        boost::multiprecision::backends::
        cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        ::assign((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                  *)((long)&(pnVar8->m_backend).m_value + lVar17 + 0x20),
                 (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                  *)((long)&(pnVar8->m_backend).m_value + lVar18 + 0x20));
        lVar14 = lVar14 + 1;
        uVar16 = uVar16 + 1;
        lVar18 = lVar18 + 0x40;
        lVar17 = lVar17 + 0x40;
      } while (lVar14 < iVar13 + iVar10);
    }
    uVar15 = (uint)uVar16;
    pDVar12 = pDVar12->next;
  } while ((U *)pDVar12 != pUVar1);
  piVar11 = (this->u).row.max;
  iVar9 = (int)((ulong)((long)*(pointer *)
                               ((long)&(this->u).row.val.val.
                                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                       ._M_impl.super__Vector_impl_data + 8) -
                       (long)(this->u).row.val.val.
                             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 6);
LAB_001b4c45:
  piVar11[this->thedim] = 0;
  (this->u).row.used = uVar15;
  iVar10 = len - piVar11[p_row];
  if (((double)iVar9 < (double)len + (double)(int)uVar15 * this->rowMemMult) &&
     (iVar13 = len + uVar15 * 2, iVar9 < iVar13)) {
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
    ::reDim(pVVar2,iVar13,true);
    spx_realloc<int*>(&(this->u).row.idx,iVar13);
    uVar15 = (this->u).row.used;
    piVar11 = (this->u).row.max;
  }
LAB_001b4cbf:
  (this->u).row.used = uVar15 + iVar10;
  piVar11[p_row] = len;
  return;
LAB_001b4934:
  do {
    iVar9 = pDVar12->idx;
    iVar10 = piVar5[iVar9];
    lVar14 = (long)iVar10;
    piVar5[iVar9] = (int)uVar16;
    iVar13 = piVar4[iVar9];
    piVar11[iVar9] = iVar13;
    if (0 < iVar13) {
      uVar16 = (ulong)(int)uVar16;
      lVar17 = lVar14 << 6;
      lVar18 = uVar16 << 6;
      do {
        piVar3[uVar16] = piVar3[lVar14];
        pnVar8 = (pVVar2->val).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        boost::multiprecision::backends::
        cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        ::assign((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                  *)((long)&(pnVar8->m_backend).m_value + lVar18),
                 (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                  *)((long)&(pnVar8->m_backend).m_value + lVar17));
        boost::multiprecision::backends::
        cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
        ::assign((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                  *)((long)&(pnVar8->m_backend).m_value + lVar18 + 0x20),
                 (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                  *)((long)&(pnVar8->m_backend).m_value + lVar17 + 0x20));
        lVar14 = lVar14 + 1;
        uVar16 = uVar16 + 1;
        lVar17 = lVar17 + 0x40;
        lVar18 = lVar18 + 0x40;
      } while (lVar14 < iVar13 + iVar10);
    }
    uVar15 = (uint)uVar16;
    pDVar12 = pDVar12->next;
  } while ((U *)pDVar12 != pUVar1);
  piVar11 = (this->u).row.max;
  iVar9 = (int)((ulong)((long)*(pointer *)
                               ((long)&(this->u).row.val.val.
                                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                       ._M_impl.super__Vector_impl_data + 8) -
                       (long)(this->u).row.val.val.
                             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 6);
LAB_001b49fe:
  piVar11[this->thedim] = 0;
  (this->u).row.used = uVar15;
  if (((double)iVar9 < (double)len + (double)(int)uVar15 * this->rowMemMult) &&
     (iVar10 = len + uVar15 * 2, iVar9 < iVar10)) {
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
    ::reDim(pVVar2,iVar10,true);
    spx_realloc<int*>(&(this->u).row.idx,iVar10);
    uVar15 = (this->u).row.used;
  }
LAB_001b4a69:
  piVar3 = (this->u).row.idx;
  piVar11 = (this->u).row.start;
  iVar9 = piVar11[p_row];
  lVar14 = (long)iVar9;
  iVar10 = (this->u).row.len[p_row];
  piVar11[p_row] = uVar15;
  piVar11 = &(this->u).row.used;
  *piVar11 = *piVar11 + len;
  piVar11 = (this->u).row.max;
  pDVar12 = (this->u).row.elem + p_row;
  pDVar6 = pDVar12->prev;
  piVar11[pDVar6->idx] = piVar11[pDVar6->idx] + piVar11[p_row];
  piVar11[p_row] = len;
  pDVar7 = pDVar12->next;
  pDVar7->prev = pDVar6;
  pDVar6->next = pDVar7;
  pDVar6 = (this->u).row.list.prev;
  pDVar7 = pDVar6->next;
  pDVar12->next = pDVar7;
  pDVar7->prev = pDVar12;
  pDVar12->prev = pDVar6;
  pDVar6->next = pDVar12;
  if (0 < iVar10) {
    piVar11 = piVar3 + (int)uVar15;
    lVar17 = (long)(int)uVar15 << 6;
    lVar18 = lVar14 << 6;
    do {
      pnVar8 = (pVVar2->val).
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      boost::multiprecision::backends::
      cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      ::assign((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                *)((long)&(pnVar8->m_backend).m_value + lVar17),
               (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                *)((long)&(pnVar8->m_backend).m_value + lVar18));
      boost::multiprecision::backends::
      cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      ::assign((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                *)((long)&(pnVar8->m_backend).m_value + lVar17 + 0x20),
               (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                *)((long)&(pnVar8->m_backend).m_value + lVar18 + 0x20));
      *piVar11 = piVar3[lVar14];
      lVar14 = lVar14 + 1;
      lVar17 = lVar17 + 0x40;
      piVar11 = piVar11 + 1;
      lVar18 = lVar18 + 0x40;
    } while (lVar14 < iVar10 + iVar9);
  }
  return;
}

Assistant:

inline void CLUFactorRational::remaxRow(int p_row, int len)
{
   assert(u.row.max[p_row] < len);

   if(u.row.elem[p_row].next == &(u.row.list))      /* last in row file */
   {
      int delta = len - u.row.max[p_row];

      if(delta > u.row.val.dim() - u.row.used)
      {
         packRows();
         delta = len - u.row.max[p_row];  // packRows() changes u.row.max[] !

         if(u.row.val.dim() < rowMemMult * u.row.used + len)
            minRowMem(2 * u.row.used + len);

         /* minRowMem(rowMemMult * u.row.used + len); */
      }

      assert(delta <= u.row.val.dim() - u.row.used

             && "ERROR: could not allocate memory for row file");

      u.row.used += delta;
      u.row.max[p_row] = len;
   }
   else                        /* row must be moved to end of row file */
   {
      int i, j, k;
      VectorRational& val = u.row.val;
      Dring* ring;

      if(len > u.row.val.dim() - u.row.used)
      {
         packRows();

         if(u.row.val.dim() < rowMemMult * u.row.used + len)
            minRowMem(2 * u.row.used + len);

         /* minRowMem(rowMemMult * u.row.used + len);*/
      }

      assert(len <= u.row.val.dim() - u.row.used

             && "ERROR: could not allocate memory for row file");

      int* idx = u.row.idx;
      j = u.row.used;
      i = u.row.start[p_row];
      k = u.row.len[p_row] + i;
      u.row.start[p_row] = j;
      u.row.used += len;

      u.row.max[u.row.elem[p_row].prev->idx] += u.row.max[p_row];
      u.row.max[p_row] = len;
      removeDR(u.row.elem[p_row]);
      ring = u.row.list.prev;
      init2DR(u.row.elem[p_row], *ring);

      for(; i < k; ++i, ++j)
      {
         val[j] = val[i];
         idx[j] = idx[i];
      }
   }

   assert(u.row.start[u.row.list.prev->idx] + u.row.max[u.row.list.prev->idx]

          == u.row.used);
}